

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Coap::Send(Error *__return_storage_ptr__,Coap *this,Message *aMessage)

{
  bool bVar1;
  MessageSubType MVar2;
  Error *aError;
  Endpoint *pEVar3;
  ErrorCode local_a4;
  Error local_a0;
  ErrorCode local_78 [4];
  Error local_68;
  undefined1 local_40 [8];
  ByteArray data;
  Message *aMessage_local;
  Coap *this_local;
  Error *error;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  Error::Error(__return_storage_ptr__);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  Message::Serialize(&local_68,aMessage,(ByteArray *)local_40);
  aError = Error::operator=(__return_storage_ptr__,&local_68);
  local_78[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_78);
  Error::~Error(&local_68);
  if (!bVar1) {
    pEVar3 = Message::GetEndpoint(aMessage);
    if (pEVar3 == (Endpoint *)0x0) {
      Message::SetEndpoint(aMessage,this->mEndpoint);
    }
    pEVar3 = Message::GetEndpoint(aMessage);
    MVar2 = Message::GetSubType(aMessage);
    (*pEVar3->_vptr_Endpoint[2])(&local_a0,pEVar3,local_40,(ulong)MVar2);
    Error::operator=(__return_storage_ptr__,&local_a0);
    Error::~Error(&local_a0);
    local_a4 = kNone;
    commissioner::operator!=(__return_storage_ptr__,&local_a4);
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  if ((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::Send(const Message &aMessage)
{
    Error     error;
    ByteArray data;
    SuccessOrExit(error = aMessage.Serialize(data));

    if (aMessage.GetEndpoint() == nullptr)
    {
        aMessage.SetEndpoint(&mEndpoint);
    }

    error = aMessage.GetEndpoint()->Send(data, aMessage.GetSubType());
    SuccessOrExit(error);

exit:
    return error;
}